

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::tcp_cache_service::session::run(session *this)

{
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> iStack_58;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_50;
  __shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  mutable_buffer local_38;
  
  booster::aio::buffer(&local_38,&this->hin_,0x28);
  std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
            (local_48,(__weak_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            ((offset_in_session_to_subr)&iStack_58,
             (shared_ptr<cppcms::impl::tcp_cache_service::session> *)on_header_in);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  intrusive_ptr(&local_50,&iStack_58);
  booster::aio::stream_socket::async_read((mutable_buffer *)&this->socket_,(callback *)&local_38);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_50);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&iStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_38.super_buffer_impl<char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return;
}

Assistant:

void run()
	{
		socket_.async_read(io::buffer(&hin_,sizeof(hin_)),
				mfunc_to_io_handler(&session::on_header_in,shared_from_this()));
	}